

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O1

TPZAutoPointer<TPZSavable> * __thiscall
TPZAutoPointer<TPZSavable>::operator=
          (TPZAutoPointer<TPZSavable> *this,TPZAutoPointer<TPZSavable> *rval)

{
  TPZReference *pTVar1;
  bool bVar2;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar2 = TPZReference::Decrease(this->fRef);
    if (bVar2) {
      if (((this->fRef != (TPZReference *)0x0) &&
          ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) &&
         (pTVar1 = this->fRef, pTVar1 != (TPZReference *)0x0)) {
        if (pTVar1->fPointer != (TPZSavable *)0x0) {
          (*pTVar1->fPointer->_vptr_TPZSavable[1])();
        }
        pTVar1->fPointer = (TPZSavable *)0x0;
        operator_delete(pTVar1,0x10);
      }
      this->fRef = (TPZReference *)0x0;
    }
  }
  this->fRef = rval->fRef;
  rval->fRef = (TPZReference *)0x0;
  return this;
}

Assistant:

TPZAutoPointer &operator=(TPZAutoPointer<T> &&rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = rval.fRef;
        rval.fRef = nullptr;
        return *this;
    }